

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void vera::splitFacesFromHorizontalRow<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  CubemapFace<float> *pCVar4;
  float *pfVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  int iFace;
  long lVar10;
  
  lVar10 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _width;
  iVar2 = SUB164(auVar1 / ZEXT816(6),0);
  uVar6 = (ulong)(uint)(iVar2 * (int)_height) * 0x300000000;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)uVar6) {
    uVar8 = uVar6 >> 0x1e;
  }
  for (; lVar10 != 6; lVar10 = lVar10 + 1) {
    pCVar4 = (CubemapFace<float> *)operator_new(0x18);
    pCVar4->data = (float *)0x0;
    pCVar4->id = 0;
    pCVar4->width = 0;
    pCVar4->height = 0;
    pCVar4->currentOffset = 0;
    _faces[lVar10] = pCVar4;
    pCVar4->id = (int)lVar10;
    pfVar5 = (float *)operator_new__(uVar8);
    pCVar4->data = pfVar5;
    pCVar4->width = iVar2;
    pCVar4->height = (int)_height;
    pCVar4->currentOffset = 0;
  }
  iVar3 = 0;
  for (sVar7 = 0; sVar7 != _height; sVar7 = sVar7 + 1) {
    iVar9 = iVar3;
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      pCVar4 = _faces[lVar10];
      if (pCVar4 != (CubemapFace<float> *)0x0) {
        memcpy(pCVar4->data + pCVar4->currentOffset,_data + iVar9,
               SUB168(auVar1 / ZEXT816(6),0) * 0xc00000000 >> 0x20);
        pCVar4->currentOffset = pCVar4->currentOffset + iVar2 * 3;
      }
      iVar9 = iVar9 + iVar2 * 3;
    }
    iVar3 = iVar3 + (int)_width * 3;
  }
  return;
}

Assistant:

void splitFacesFromHorizontalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 6;
    int faceHeight = _height;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        // int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 i      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[iFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}